

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O2

bool __thiscall point::operator<(point *this,point *ff)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = this->d;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  do {
    uVar5 = uVar6;
    uVar6 = uVar5;
    if (uVar4 == uVar5) goto LAB_00103c6f;
    iVar2 = (ff->f).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar5];
    iVar3 = (this->f).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar5];
    uVar6 = uVar5 + 1;
  } while (iVar3 == iVar2);
  uVar6 = (ulong)(iVar3 < iVar2);
LAB_00103c6f:
  return (bool)((long)uVar5 < (long)(int)uVar1 & (byte)uVar6);
}

Assistant:

bool operator<(const point ff) const {
        for (int i = 0; i < d; ++i) {
            if (f[i] != ff.f[i]) {
                return f[i] < ff.f[i];
            }
        }
        return false;
    }